

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_roi_utils.c
# Opt level: O3

MPP_RET gen_vepu54x_roi(MppEncRoiImpl *ctx,Vepu541RoiCfg *dst)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  MPP_RET MVar5;
  uint uVar6;
  RK_S32 RVar7;
  int iVar8;
  MPP_RET MVar9;
  uint uVar10;
  void *pvVar11;
  int iVar12;
  void *pvVar13;
  Vepu541RoiCfg *pVVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  uint uVar20;
  RoiRegionCfg *pRVar21;
  uint uVar22;
  uint uVar23;
  RK_U8 *pRVar24;
  
  pRVar21 = ctx->regions;
  iVar8 = ctx->w + 0xf >> 4;
  iVar12 = ctx->h + 0xf >> 4;
  uVar23 = iVar8 + 3U & 0xfffffffc;
  pvVar11 = memset(ctx->cu_map,0,(ulong)ctx->cu_size);
  uVar16 = (iVar12 + 3U & 0x3ffffffc) * uVar23;
  if (0 < (int)uVar16) {
    pvVar11 = (void *)(ulong)uVar16;
    pvVar13 = (void *)0x0;
    do {
      *(undefined8 *)(dst + (long)pvVar13) = 0x80008000800080;
      *(undefined8 *)(dst + (long)pvVar13 + 4) = 0x80008000800080;
      pvVar13 = (void *)((long)pvVar13 + 8);
    } while (pvVar11 != pvVar13);
  }
  iVar4 = ctx->w;
  MVar9 = (MPP_RET)CONCAT71((int7)((ulong)pvVar11 >> 8),iVar4 < 1);
  if (ctx->h < 1 || iVar4 < 1) {
    MVar9 = _mpp_log_l(2,"enc_roi_utils","invalid size [%d:%d]\n","gen_vepu54x_roi");
    return MVar9;
  }
  MVar5 = ctx->count;
  if (MPP_OK < MVar5) {
    MVar9 = MPP_OK;
    do {
      if ((iVar4 < (int)((uint)pRVar21->w + (uint)pRVar21->x)) ||
         (iVar18 = 0, ctx->h < (int)((uint)pRVar21->h + (uint)pRVar21->y))) {
        iVar18 = -1;
      }
      iVar15 = -1;
      if ((pRVar21->force_intra < 2) && (iVar15 = iVar18, 1 < pRVar21->qp_mode)) {
LAB_0010a841:
        _mpp_log_l(2,"enc_roi_utils","region %d invalid param:\n","gen_vepu54x_roi",MVar9);
        _mpp_log_l(2,"enc_roi_utils","position [%d:%d:%d:%d] vs [%d:%d]\n","gen_vepu54x_roi",
                   pRVar21->x,pRVar21->y,pRVar21->w,pRVar21->h,ctx->w,ctx->h);
        MVar9 = _mpp_log_l(2,"enc_roi_utils","force intra %d qp mode %d val %d\n","gen_vepu54x_roi",
                           pRVar21->force_intra,pRVar21->qp_mode,pRVar21->qp_val);
        return MVar9;
      }
      if (pRVar21->qp_mode == 0) {
        if ((iVar15 != 0) || (0x66 < pRVar21->qp_val + 0x33U)) goto LAB_0010a841;
      }
      else if ((iVar15 != 0) || (0x33 < pRVar21->qp_val)) goto LAB_0010a841;
      MVar9 = MVar9 + ~MPP_ERR_UNKNOW;
      pRVar21 = pRVar21 + 1;
    } while (MVar5 != MVar9);
    if (MPP_OK < MVar5) {
      pRVar21 = ctx->regions;
      uVar16 = (int)(iVar8 + 3U) >> 2;
      MVar9 = MPP_OK;
      do {
        pRVar24 = ctx->cu_map;
        uVar1 = pRVar21->w;
        uVar2 = pRVar21->h;
        uVar10 = pRVar21->x + 0xf >> 4;
        uVar3 = pRVar21->y;
        if (((((iVar8 <= (int)uVar10) &&
              (_mpp_log_l(2,"enc_roi_utils","Assertion %s failed at %s:%d\n",0,
                          "pos_x_init >= 0 && pos_x_init < mb_w","gen_vepu54x_roi",0x120),
              (DAT_0011c3b3 & 0x10) != 0)) ||
             ((uVar17 = uVar1 + 0xf >> 4, iVar8 < (int)(uVar10 + uVar17) &&
              (_mpp_log_l(2,"enc_roi_utils","Assertion %s failed at %s:%d\n",0,
                          "pos_x_end >= 0 && pos_x_end <= mb_w","gen_vepu54x_roi",0x121),
              (DAT_0011c3b3 & 0x10) != 0)))) ||
            ((uVar22 = uVar3 + 0xf >> 4, iVar12 <= (int)uVar22 &&
             (_mpp_log_l(2,"enc_roi_utils","Assertion %s failed at %s:%d\n",0,
                         "pos_y_init >= 0 && pos_y_init < mb_h","gen_vepu54x_roi",0x122),
             (DAT_0011c3b3 & 0x10) != 0)))) ||
           ((uVar20 = uVar2 + 0xf >> 4, iVar12 < (int)(uVar22 + uVar20) &&
            (_mpp_log_l(2,"enc_roi_utils","Assertion %s failed at %s:%d\n",0,
                        "pos_y_end >= 0 && pos_y_end <= mb_h","gen_vepu54x_roi",0x123),
            (DAT_0011c3b3 & 0x10) != 0)))) {
          abort();
        }
        if (uVar2 != 0) {
          RVar7 = pRVar21->force_intra;
          iVar4 = pRVar21->qp_mode;
          uVar6 = pRVar21->qp_val;
          iVar18 = uVar22 * uVar23 + uVar10;
          pRVar24 = pRVar24 + iVar18;
          pVVar14 = dst + iVar18;
          uVar10 = 0;
          do {
            if (uVar1 != 0) {
              uVar19 = 0;
              do {
                pVVar14[uVar19] =
                     (Vepu541RoiCfg)
                     ((short)(iVar4 << 0xf) + ((ushort)((uVar6 & 0x7f) << 8) | (ushort)RVar7 & 1) +
                     0x80);
                if (ctx->type == MPP_VIDEO_CodingAVC) {
                  pRVar24[uVar19] = '\x01';
                }
                uVar19 = uVar19 + 1;
              } while (uVar17 != uVar19);
            }
            pRVar24 = pRVar24 + (int)uVar23;
            uVar10 = uVar10 + 1;
            pVVar14 = pVVar14 + (int)uVar23;
          } while (uVar10 != uVar20);
        }
        if (ctx->type == MPP_VIDEO_CodingHEVC) {
          uVar10 = pRVar21->w + 0x40 >> 6;
          uVar1 = pRVar21->x;
          if (uVar1 < 0x40) {
            uVar10 = uVar10 + 2;
            uVar17 = 0;
          }
          else if ((uVar1 & 0x3f) == 0) {
            uVar17 = (uint)(uVar1 >> 6);
          }
          else {
            uVar17 = uVar1 - 0x40 >> 6;
            uVar10 = uVar10 + 2;
          }
          uVar22 = pRVar21->h + 0x40 >> 6;
          uVar1 = pRVar21->y;
          if (uVar1 < 0x40) {
            uVar22 = uVar22 + 2;
            uVar20 = 0;
          }
          else if ((uVar1 & 0x3f) == 0) {
            uVar20 = (uint)(uVar1 >> 6);
          }
          else {
            uVar20 = uVar1 - 0x40 >> 6;
            uVar22 = uVar22 + 2;
          }
          pRVar24 = ctx->cu_map + (uVar16 * uVar20 + uVar17);
          do {
            memset(pRVar24,1,(ulong)uVar10);
            pRVar24 = pRVar24 + uVar16;
            uVar22 = uVar22 - 1;
          } while (uVar22 != 0);
        }
        MVar9 = MVar9 + ~MPP_ERR_UNKNOW;
        pRVar21 = pRVar21 + 1;
      } while (MVar9 < ctx->count);
    }
  }
  return MVar9;
}

Assistant:

static MPP_RET gen_vepu54x_roi(MppEncRoiImpl *ctx, Vepu541RoiCfg *dst)
{
    RoiRegionCfg *region = ctx->regions;
    RK_S32 mb_w = MPP_ALIGN(ctx->w, 16) / 16;
    RK_S32 mb_h = MPP_ALIGN(ctx->h, 16) / 16;
    RK_S32 stride_h = MPP_ALIGN(mb_w, 4);
    RK_S32 stride_v = MPP_ALIGN(mb_h, 4);
    Vepu541RoiCfg cfg;
    MPP_RET ret = MPP_NOK;
    RK_S32 i;

    memset(ctx->cu_map, 0, ctx->cu_size);

    cfg.force_intra = 0;
    cfg.reserved    = 0;
    cfg.qp_area_idx = 0;
    cfg.qp_area_en  = 1;
    cfg.qp_adj      = 0;
    cfg.qp_adj_mode = 0;

    /* step 1. reset all the config */
    for (i = 0; i < stride_h * stride_v; i++)
        memcpy(dst + i, &cfg, sizeof(cfg));

    if (ctx->w <= 0 || ctx->h <= 0) {
        mpp_err_f("invalid size [%d:%d]\n", ctx->w, ctx->h);
        goto DONE;
    }

    /* check region config */
    ret = MPP_OK;
    for (i = 0; i < ctx->count; i++, region++) {
        if (region->x + region->w > ctx->w || region->y + region->h > ctx->h)
            ret = MPP_NOK;

        if (region->force_intra > 1 || region->qp_mode > 1)
            ret = MPP_NOK;

        if ((region->qp_mode && region->qp_val > 51) ||
            (!region->qp_mode && (region->qp_val > 51 || region->qp_val < -51)))
            ret = MPP_NOK;

        if (ret) {
            mpp_err_f("region %d invalid param:\n", i);
            mpp_err_f("position [%d:%d:%d:%d] vs [%d:%d]\n",
                      region->x, region->y, region->w, region->h, ctx->w, ctx->h);
            mpp_err_f("force intra %d qp mode %d val %d\n",
                      region->force_intra, region->qp_mode, region->qp_val);
            goto DONE;
        }
    }

    region = ctx->regions;
    /* step 2. setup region for top to bottom */
    for (i = 0; i < ctx->count; i++, region++) {
        Vepu541RoiCfg *p = dst;
        RK_U8 *map = ctx->cu_map;
        RK_S32 roi_width  = (region->w + 15) / 16;
        RK_S32 roi_height = (region->h + 15) / 16;
        RK_S32 pos_x_init = (region->x + 15) / 16;
        RK_S32 pos_y_init = (region->y + 15) / 16;
        RK_S32 pos_x_end  = pos_x_init + roi_width;
        RK_S32 pos_y_end  = pos_y_init + roi_height;
        RK_S32 x, y;

        mpp_assert(pos_x_init >= 0 && pos_x_init < mb_w);
        mpp_assert(pos_x_end  >= 0 && pos_x_end <= mb_w);
        mpp_assert(pos_y_init >= 0 && pos_y_init < mb_h);
        mpp_assert(pos_y_end  >= 0 && pos_y_end <= mb_h);

        cfg.force_intra = region->force_intra;
        cfg.reserved    = 0;
        cfg.qp_area_idx = 0;
        // NOTE: When roi is enabled the qp_area_en should be one.
        cfg.qp_area_en  = 1; // region->area_map_en;
        cfg.qp_adj      = region->qp_val;
        cfg.qp_adj_mode = region->qp_mode;

        p += pos_y_init * stride_h + pos_x_init;
        map += pos_y_init * stride_h + pos_x_init;
        for (y = 0; y < roi_height; y++) {
            for (x = 0; x < roi_width; x++) {
                memcpy(p + x, &cfg, sizeof(cfg));
                if (ctx->type == MPP_VIDEO_CodingAVC) {
                    *(map + x) = 1;
                }

            }
            p += stride_h;
            map += stride_h;
        }

        if (ctx->type == MPP_VIDEO_CodingHEVC) {
            map = ctx->cu_map;
            RK_U32 stride_cu64_h = stride_h * 16 / 64;

            roi_width  = (region->w + 64) / 64;
            roi_height = (region->h + 64) / 64;

            if (region->x < 64) {
                pos_x_init = 0;
                roi_width += 2;
            } else if (region->x % 64) {
                pos_x_init = (region->x - 64) / 64;
                roi_width += 2;
            } else
                pos_x_init = region->x / 64;

            if (region->y < 64) {
                pos_y_init = 0;
                roi_height += 2;
            } else if (region->y % 64) {
                pos_y_init = (region->y - 64) / 64;
                roi_height += 2;
            } else
                pos_y_init = region->y / 64;

            map += pos_y_init * stride_cu64_h + pos_x_init;
            for (y = 0; y < roi_height; y++) {
                for (x = 0; x < roi_width; x++) {
                    *(map + x) = 1;
                }
                map += stride_cu64_h;
            }
        }
    }

DONE:
    return ret;
}